

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int translateState(int state)

{
  int mods;
  int state_local;
  
  mods = (int)((state & 1U) != 0);
  if ((state & 4U) != 0) {
    mods = mods | 2;
  }
  if ((state & 8U) != 0) {
    mods = mods | 4;
  }
  if ((state & 0x40U) != 0) {
    mods = mods | 8;
  }
  if ((state & 2U) != 0) {
    mods = mods | 0x10;
  }
  if ((state & 0x10U) != 0) {
    mods = mods | 0x20;
  }
  return mods;
}

Assistant:

static int translateState(int state)
{
    int mods = 0;

    if (state & ShiftMask)
        mods |= GLFW_MOD_SHIFT;
    if (state & ControlMask)
        mods |= GLFW_MOD_CONTROL;
    if (state & Mod1Mask)
        mods |= GLFW_MOD_ALT;
    if (state & Mod4Mask)
        mods |= GLFW_MOD_SUPER;
    if (state & LockMask)
        mods |= GLFW_MOD_CAPS_LOCK;
    if (state & Mod2Mask)
        mods |= GLFW_MOD_NUM_LOCK;

    return mods;
}